

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginGlobal
          (BinaryReaderInterp *this,Index index,Type type,bool mutable_)

{
  ModuleDesc *pMVar1;
  initializer_list<wabt::Type> __l;
  bool bVar2;
  Mutability mut;
  pointer *this_00;
  value_type local_1d0;
  allocator<wabt::Type> local_139;
  Type local_138;
  iterator local_130;
  size_type local_128;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_120;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_108;
  undefined1 local_f0 [8];
  FuncDesc init_func;
  undefined1 local_70 [8];
  GlobalType global_type;
  Location local_50;
  Enum local_2c;
  byte local_25;
  Index local_24;
  bool mutable__local;
  BinaryReaderInterp *pBStack_20;
  Index index_local;
  BinaryReaderInterp *this_local;
  Index IStack_10;
  Type type_local;
  
  local_25 = mutable_;
  local_24 = index;
  pBStack_20 = this;
  unique0x100003a9 = type;
  GetLocation(&local_50,this);
  global_type._16_4_ = this_local._4_4_;
  global_type.mut = IStack_10;
  local_2c = (Enum)SharedValidator::OnGlobal
                             (&this->validator_,&local_50,stack0xffffffffffffffec,
                              (bool)(local_25 & 1));
  bVar2 = Failed((Result)local_2c);
  if (bVar2) {
    Result::Result((Result *)&type_local,Error);
  }
  else {
    init_func.handlers.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)stack0xffffffffffffffec;
    mut = ToMutability((bool)(local_25 & 1));
    GlobalType::GlobalType
              ((GlobalType *)local_70,
               (ValueType)
               init_func.handlers.
               super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,mut);
    memset(&local_108,0,0x18);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_108);
    local_138 = stack0xffffffffffffffec;
    local_130 = &local_138;
    local_128 = 1;
    std::allocator<wabt::Type>::allocator(&local_139);
    __l._M_len = local_128;
    __l._M_array = local_130;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_120,__l,&local_139);
    FuncType::FuncType((FuncType *)local_f0,&local_108,&local_120);
    this_00 = &init_func.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    memset(this_00,0,0x18);
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
              ((vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> *)this_00)
    ;
    init_func.locals.
    super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
    memset(&init_func.code_offset,0,0x18);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
               &init_func.code_offset);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_120);
    std::allocator<wabt::Type>::~allocator(&local_139);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_108);
    pMVar1 = this->module_;
    GlobalType::GlobalType(&local_1d0.type,(GlobalType *)local_70);
    FuncDesc::FuncDesc(&local_1d0.init_func,(FuncDesc *)local_f0);
    std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::push_back
              (&pMVar1->globals,&local_1d0);
    GlobalDesc::~GlobalDesc(&local_1d0);
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,(value_type *)local_70);
    Result::Result((Result *)&type_local,Ok);
    FuncDesc::~FuncDesc((FuncDesc *)local_f0);
    GlobalType::~GlobalType((GlobalType *)local_70);
  }
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::BeginGlobal(Index index, Type type, bool mutable_) {
  CHECK_RESULT(validator_.OnGlobal(GetLocation(), type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  FuncDesc init_func{FuncType{{}, {type}}, {}, Istream::kInvalidOffset, {}};
  module_.globals.push_back(GlobalDesc{global_type, init_func});
  global_types_.push_back(global_type);
  return Result::Ok;
}